

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64 drwav_read_pcm_frames_be(drwav *pWav,drwav_uint64 framesToRead,void *pBufferOut)

{
  ulong uVar1;
  undefined1 uVar2;
  ushort uVar3;
  drwav_uint32 dVar4;
  drwav_uint64 dVar5;
  ulong uVar6;
  undefined1 *puVar7;
  uint uVar8;
  long in_RDX;
  drwav *in_RDI;
  drwav_uint64 framesRead;
  drwav_uint64 iSample_5;
  drwav_uint64 iSample;
  drwav_uint64 iSample_2;
  drwav_uint64 iSample_3;
  drwav_uint8 *pSample;
  drwav_uint64 iSample_1;
  drwav_uint8 t;
  drwav_uint64 iSample_4;
  anon_union_8_2_947300a4 x_1;
  anon_union_4_2_947300a4 x;
  void *in_stack_fffffffffffffea0;
  drwav_uint64 in_stack_fffffffffffffea8;
  drwav *in_stack_fffffffffffffeb0;
  ulong local_110;
  ulong local_e0;
  ulong local_c8;
  ulong local_98;
  ulong local_78;
  ulong local_50;
  
  dVar5 = drwav_read_pcm_frames_le
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  if (in_RDX != 0) {
    uVar6 = dVar5 * in_RDI->channels;
    dVar4 = drwav_get_bytes_per_pcm_frame(in_RDI);
    uVar8 = dVar4 / in_RDI->channels;
    switch(in_RDI->translatedFormatTag) {
    case 1:
      if (uVar8 == 2) {
        for (local_e0 = 0; local_e0 < uVar6; local_e0 = local_e0 + 1) {
          uVar3 = *(ushort *)(in_RDX + local_e0 * 2);
          *(ushort *)(in_RDX + local_e0 * 2) = uVar3 << 8 | uVar3 >> 8;
        }
      }
      else if (uVar8 == 3) {
        for (local_78 = 0; local_78 < uVar6; local_78 = local_78 + 1) {
          puVar7 = (undefined1 *)(in_RDX + local_78 * 3);
          uVar2 = *puVar7;
          *puVar7 = puVar7[2];
          puVar7[2] = uVar2;
        }
      }
      else {
        if (uVar8 != 4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                        ,0x553,"void drwav__bswap_samples_pcm(void *, drwav_uint64, drwav_uint32)");
        }
        for (local_c8 = 0; local_c8 < uVar6; local_c8 = local_c8 + 1) {
          uVar8 = *(uint *)(in_RDX + local_c8 * 4);
          *(uint *)(in_RDX + local_c8 * 4) =
               uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        }
      }
      break;
    case 2:
    case 0x11:
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                    ,0x58b,
                    "void drwav__bswap_samples(void *, drwav_uint64, drwav_uint32, drwav_uint16)");
    case 3:
      if (uVar8 == 4) {
        for (local_98 = 0; local_98 < uVar6; local_98 = local_98 + 1) {
          uVar8 = *(uint *)(in_RDX + local_98 * 4);
          *(uint *)(in_RDX + local_98 * 4) =
               uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        }
      }
      else {
        if (uVar8 != 8) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                        ,0x56d,"void drwav__bswap_samples_ieee(void *, drwav_uint64, drwav_uint32)")
          ;
        }
        for (local_50 = 0; local_50 < uVar6; local_50 = local_50 + 1) {
          uVar1 = *(ulong *)(in_RDX + local_50 * 8);
          *(ulong *)(in_RDX + local_50 * 8) =
               uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
               | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 |
               (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
        }
      }
      break;
    case 6:
    case 7:
      for (local_110 = 0; local_110 < uVar6; local_110 = local_110 + 1) {
        uVar3 = *(ushort *)(in_RDX + local_110 * 2);
        *(ushort *)(in_RDX + local_110 * 2) = uVar3 << 8 | uVar3 >> 8;
      }
    }
  }
  return dVar5;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_be(drwav* pWav, drwav_uint64 framesToRead, void* pBufferOut)
{
    drwav_uint64 framesRead = drwav_read_pcm_frames_le(pWav, framesToRead, pBufferOut);

    if (pBufferOut != NULL) {
        drwav__bswap_samples(pBufferOut, framesRead*pWav->channels, drwav_get_bytes_per_pcm_frame(pWav)/pWav->channels, pWav->translatedFormatTag);
    }

    return framesRead;
}